

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvrm.c
# Opt level: O0

gpu_object *
nvrm_find_object_by_func(gpu_object *parent,_func_int_gpu_object_ptr_uint64_t *check,uint64_t ctx)

{
  int iVar1;
  gpu_object *pgVar2;
  int local_34;
  int i;
  gpu_object *ret;
  uint64_t ctx_local;
  _func_int_gpu_object_ptr_uint64_t *check_local;
  gpu_object *parent_local;
  
  iVar1 = (*check)(parent,ctx);
  parent_local = parent;
  if (iVar1 == 0) {
    for (local_34 = 0; local_34 < parent->children_space; local_34 = local_34 + 1) {
      if ((parent->children_objects[local_34] != (gpu_object *)0x0) &&
         (pgVar2 = nvrm_find_object_by_func(parent->children_objects[local_34],check,ctx),
         pgVar2 != (gpu_object *)0x0)) {
        return pgVar2;
      }
    }
    parent_local = (gpu_object *)0x0;
  }
  return parent_local;
}

Assistant:

static struct gpu_object *nvrm_find_object_by_func(struct gpu_object *parent,
		int (*check)(struct gpu_object *, uint64_t), uint64_t ctx)
{
	struct gpu_object *ret;
	int i;
	if (check(parent, ctx))
		return parent;

	for (i = 0; i < parent->children_space; ++i)
		if (parent->children_objects[i])
		{
			ret = nvrm_find_object_by_func(parent->children_objects[i], check, ctx);
			if (ret)
				return ret;
		}
	return NULL;
}